

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_math.cpp
# Opt level: O0

SW_FT_Angle SW_FT_Angle_Diff(SW_FT_Angle angle1,SW_FT_Angle angle2)

{
  SW_FT_Angle delta;
  SW_FT_Angle angle2_local;
  SW_FT_Angle angle1_local;
  
  for (delta = angle2 - angle1; delta < -0xb3ffff; delta = delta + 0x1680000) {
  }
  for (; 0xb40000 < delta; delta = delta + -0x1680000) {
  }
  return delta;
}

Assistant:

SW_FT_Angle SW_FT_Angle_Diff( SW_FT_Angle  angle1, SW_FT_Angle  angle2 )
{
  SW_FT_Angle  delta = angle2 - angle1;

  while ( delta <= -SW_FT_ANGLE_PI )
    delta += SW_FT_ANGLE_2PI;

  while ( delta > SW_FT_ANGLE_PI )
    delta -= SW_FT_ANGLE_2PI;

  return delta;
}